

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.c
# Opt level: O0

void w_handle_failed_assertion(char *expr,char *fn,char *file,int line)

{
  int iVar1;
  char local_428 [8];
  char msg [1024];
  int line_local;
  char *file_local;
  char *fn_local;
  char *expr_local;
  
  msg._1020_4_ = line;
  iVar1 = w_format_msg(local_428,0x400,
                       "---------------------------\n /!\\ ASSERTION FAILURE /!\\ \n---------------------------\nexpression : %s\n  function : %s\n      file : %s\n      line : %d\n"
                       ,expr,fn,file,line);
  if (iVar1 == 0) {
    w_print(_stderr,local_428);
  }
  w_abort(-1);
  return;
}

Assistant:

void
w_handle_failed_assertion(
    const char *expr,
    const char *fn,
    const char *file,
    int line
)
{
    char msg[1024];

    if (
        w_format_msg(
            msg,
            W_GET_ARRAY_LEN(msg),
            WP_ASSERT_ASSERTION_FAILURE_FMT,
            expr,
            fn,
            file,
            line
        )
        == 0
    )
    {
        w_print(W_STD_ERR, msg);
    }

    w_abort(-1);
}